

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O2

void __thiscall Jupiter::Plugin::setDirectory(Plugin *this,string_view dir)

{
  string_view dir_local;
  
  dir_local._M_str = (char *)dir._M_len;
  dir_local._M_len = (size_t)this;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&plugins_directory_abi_cxx11_,&dir_local);
  if ((plugins_directory_abi_cxx11_._M_string_length != 0) &&
     (plugins_directory_abi_cxx11_._M_dataplus._M_p
      [plugins_directory_abi_cxx11_._M_string_length - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&plugins_directory_abi_cxx11_,'/');
  }
  return;
}

Assistant:

void Jupiter::Plugin::setDirectory(std::string_view dir) {
	plugins_directory = dir;
	if (!plugins_directory.empty() && plugins_directory.back() != directory_character) {
		plugins_directory += directory_character;
	}
}